

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_function.hpp
# Opt level: O2

double duckdb::MultiFileFunction<duckdb::ParquetMultiFileInfo>::MultiFileProgress
                 (ClientContext *context,FunctionData *bind_data_p,
                 GlobalTableFunctionState *global_state)

{
  long lVar1;
  const_reference this;
  type context_00;
  type pBVar2;
  ClientContext *context_01;
  ulong __n;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double dVar6;
  shared_ptr<duckdb::BaseFileReader,_true> reader;
  unique_lock<std::mutex> parallel_lock;
  double local_68;
  long local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  unique_lock<std::mutex> local_40;
  
  lVar1 = (**(code **)(**(long **)(global_state + 8) + 0x30))();
  if (lVar1 == 0) {
    local_68 = 100.0;
  }
  else {
    std::unique_lock<std::mutex>::unique_lock(&local_40,(mutex_type *)(global_state + 0x28));
    __n = *(ulong *)(global_state + 0x60);
    auVar4._8_4_ = (int)(__n >> 0x20);
    auVar4._0_8_ = __n;
    auVar4._12_4_ = 0x45300000;
    local_68 = ((auVar4._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)__n) - 4503599627370496.0)) * 100.0;
    for (; (__n <= *(ulong *)(global_state + 0x58) &&
           (__n < (ulong)(*(long *)(global_state + 0x70) - *(long *)(global_state + 0x68) >> 3)));
        __n = __n + 1) {
      this = vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_true>
             ::get<true>((vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_true>
                          *)(global_state + 0x68),__n);
      if ((this->
          super_unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>_>
          )._M_t.
          super___uniq_ptr_impl<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::MultiFileReaderData_*,_std::default_delete<duckdb::MultiFileReaderData>_>
          .super__Head_base<0UL,_duckdb::MultiFileReaderData_*,_false>._M_head_impl !=
          (MultiFileReaderData *)0x0) {
        context_00 = unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>
                     ::operator*(this);
        if (context_00->file_state == CLOSED) {
          weak_ptr<duckdb::BaseFileReader,_true>::lock
                    ((weak_ptr<duckdb::BaseFileReader,_true> *)&local_50);
          dVar3 = 100.0;
          if (local_50 != 0) {
            context_01 = (ClientContext *)&local_50;
            pBVar2 = shared_ptr<duckdb::BaseFileReader,_true>::operator*
                               ((shared_ptr<duckdb::BaseFileReader,_true> *)&local_50);
            dVar3 = ParquetMultiFileInfo::GetProgressInFile(context_01,pBVar2);
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
        }
        else {
          dVar3 = 0.0;
          if (context_00->file_state == OPEN) {
            pBVar2 = shared_ptr<duckdb::BaseFileReader,_true>::operator*(&context_00->reader);
            dVar3 = ParquetMultiFileInfo::GetProgressInFile((ClientContext *)context_00,pBVar2);
          }
        }
        dVar6 = 100.0;
        if (dVar3 <= 100.0) {
          dVar6 = dVar3;
        }
        dVar3 = 0.0;
        if (0.0 <= dVar6) {
          dVar3 = dVar6;
        }
        local_68 = local_68 + dVar3;
        if ((__n == *(ulong *)(global_state + 0x60)) && (100.0 <= dVar3)) {
          *(ulong *)(global_state + 0x60) = __n + 1;
        }
      }
    }
    auVar5._8_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar5._0_8_ = lVar1;
    auVar5._12_4_ = 0x45300000;
    local_68 = local_68 /
               ((auVar5._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0));
    std::unique_lock<std::mutex>::~unique_lock(&local_40);
  }
  return local_68;
}

Assistant:

static double MultiFileProgress(ClientContext &context, const FunctionData *bind_data_p,
	                                const GlobalTableFunctionState *global_state) {
		auto &gstate = global_state->Cast<MultiFileGlobalState>();

		auto total_count = gstate.file_list.GetTotalFileCount();
		if (total_count == 0) {
			return 100.0;
		}
		unique_lock<mutex> parallel_lock(gstate.lock);
		double total_progress = 100.0 * static_cast<double>(gstate.completed_file_index);
		// iterate over the files we haven't completed yet
		for (idx_t i = gstate.completed_file_index; i <= gstate.file_index && i < gstate.readers.size(); i++) {
			auto &reader_data_ptr = gstate.readers[i];
			if (!reader_data_ptr) {
				continue;
			}
			auto &reader_data = *reader_data_ptr;
			double progress_in_file;
			if (reader_data.file_state == MultiFileFileState::OPEN) {
				// file is currently open - get the progress within the file
				progress_in_file = OP::GetProgressInFile(context, *reader_data.reader);
			} else if (reader_data.file_state == MultiFileFileState::CLOSED) {
				// file has been closed - check if the reader is still in use
				auto reader = reader_data.closed_reader.lock();
				if (!reader) {
					// reader has been destroyed - we are done with this file
					progress_in_file = 100.0;
				} else {
					// file is still being read
					progress_in_file = OP::GetProgressInFile(context, *reader);
				}
			} else {
				// file has not been opened yet - progress in this file is zero
				progress_in_file = 0;
			}
			progress_in_file = MaxValue<double>(0.0, MinValue<double>(100.0, progress_in_file));
			total_progress += progress_in_file;
			if (i == gstate.completed_file_index && progress_in_file >= 100) {
				// if the progress in this file is 100, we have completed the file
				// we don't need to check anymore in the next iteration
				gstate.completed_file_index++;
			}
		}
		return total_progress / static_cast<double>(total_count);
	}